

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode93Reader.cpp
# Opt level: O1

bool ZXing::OneD::IsStartGuard(PatternView *window,int spaceInPixel)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  FixedPattern<4,_4,_false> local_10;
  
  local_10._data[0] = 1;
  local_10._data[1] = 1;
  local_10._data[2] = 1;
  local_10._data[3] = 1;
  dVar4 = IsPattern<false,4,4>(window,&local_10,spaceInPixel,6.0,0.0);
  if (((dVar4 == 0.0) && (!NAN(dVar4))) ||
     (uVar1 = window->_data[5],
     (int)(uint)window->_data[4] <= (int)((uint)uVar1 + (uint)uVar1 * 2 + -2))) {
    bVar3 = false;
  }
  else {
    iVar2 = RowReader::OneToFourBitPattern<6,9>(window);
    bVar3 = iVar2 == 0x15e;
  }
  return bVar3;
}

Assistant:

static bool IsStartGuard(const PatternView& window, int spaceInPixel)
{
	// The complete start pattern is FixedPattern<CHAR_LEN, CHAR_SUM>{1, 1, 1, 1, 4, 1}.
	// Use only the first 4 elements which results in more than a 2x speedup. This is counter-intuitive since we save at
	// most 1/3rd of the loop iterations in FindPattern. The reason might be a successful vectorization with the limited
	// pattern size that is missed otherwise. We check for the remaining 2 slots for plausibility of the 4:1 ratio.
	return IsPattern(window, FixedPattern<4, 4>{1, 1, 1, 1}, spaceInPixel, QUIET_ZONE_SCALE * 12) &&
		   window[4] > 3 * window[5] - 2 &&
		   RowReader::OneToFourBitPattern<CHAR_LEN, CHAR_SUM>(window) == ASTERISK_ENCODING;
}